

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void c4::yml::report_error_impl(char *msg,size_t length,Location loc,FILE *f)

{
  bool bVar1;
  
  if (f == (FILE *)0x0) {
    f = (FILE *)_stderr;
  }
  bVar1 = Location::operator_cast_to_bool(&loc);
  if (bVar1) {
    if (loc.name.str != (char *)0x0 && loc.name.len != 0) {
      fwrite(loc.name.str,1,loc.name.len,(FILE *)f);
      fputc(0x3a,(FILE *)f);
    }
    fprintf((FILE *)f,"%zu:",loc.super_LineCol.line);
    if (loc.super_LineCol.col != 0) {
      fprintf((FILE *)f,"%zu:");
    }
    if (loc.super_LineCol.offset != 0) {
      fprintf((FILE *)f," (%zuB):");
    }
  }
  fprintf((FILE *)f,"%.*s\n",length & 0xffffffff,msg);
  fflush((FILE *)f);
  return;
}

Assistant:

void report_error_impl(const char* msg, size_t length, Location loc, FILE *f)
{
    if(!f)
        f = stderr;
    if(loc)
    {
        if(!loc.name.empty())
        {
            fwrite(loc.name.str, 1, loc.name.len, f);
            fputc(':', f);
        }
        fprintf(f, "%zu:", loc.line);
        if(loc.col)
            fprintf(f, "%zu:", loc.col);
        if(loc.offset)
            fprintf(f, " (%zuB):", loc.offset);
    }
    fprintf(f, "%.*s\n", (int)length, msg);
    fflush(f);
}